

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ktx::convertUINT<ImageT<unsigned_char,3u>>
          (unique_ptr<Image,_std::default_delete<Image>_> *image,string_view swizzle)

{
  bool bVar1;
  pointer pIVar2;
  char *in_RCX;
  size_t in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    pIVar2 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                       ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1ef7ed);
    (*pIVar2->_vptr_Image[0x15])(pIVar2,local_18._M_len,local_18._M_str);
  }
  pIVar2 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                     ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1ef821);
  (*pIVar2->_vptr_Image[0xd])(in_RDI,pIVar2,3,8);
  return in_RDI;
}

Assistant:

std::vector<uint8_t> convertUINT(const std::unique_ptr<Image>& image, std::string_view swizzle = "") {
    using ComponentT = typename T::Color::value_type;
    static constexpr auto componentCount = T::Color::getComponentCount();
    static constexpr auto bytesPerComponent = sizeof(ComponentT);
    static constexpr auto bits = bytesPerComponent * 8;

    if (!swizzle.empty())
        image->swizzle(swizzle);

    return image->getUINT(componentCount, bits);
}